

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::unary<tcu::Vector<unsigned_int,_2>,_double>::call
          (unary<tcu::Vector<unsigned_int,_2>,_double> *this,GLvoid *result_dst,GLvoid *argument_src
          )

{
  double arg;
  undefined8 local_20;
  undefined8 local_18;
  
  local_18 = *argument_src;
  (*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(&local_20);
  *(undefined8 *)result_dst = local_20;
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}